

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestcompareUInt::runTestCase(TestValueTestcompareUInt *this)

{
  Value *in_RDI;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  UInt in_stack_fffffffffffffe5c;
  UInt value;
  Value *in_stack_fffffffffffffe68;
  ValueTest *in_stack_fffffffffffffe70;
  Value *in_stack_fffffffffffffe90;
  undefined4 local_148 [2];
  char *local_140;
  undefined4 local_138;
  char *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined4 local_c8 [2];
  char *local_c0;
  undefined4 local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_38 [2];
  char *local_30;
  undefined4 local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_28 = 0x52b;
  local_20 = "checkIsLess(0u, 10u)";
  local_18 = 0;
  local_10 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_38;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_38;
  Json::Value::Value(in_RDI,in_stack_fffffffffffffe5c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffe5c);
  ValueTest::checkIsLess(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_c8[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_b8 = 0x52c;
  local_b0 = "checkIsLess(0u, Json::Value::maxUInt)";
  local_a8 = 0;
  local_a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_c8;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_c8;
  Json::Value::Value(in_RDI,in_stack_fffffffffffffe5c);
  Json::Value::Value(in_RDI,in_stack_fffffffffffffe5c);
  ValueTest::checkIsLess(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  local_148[0] = **(undefined4 **)&in_RDI->field_0x8;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_138 = 0x52d;
  local_130 = "checkIsEqual(10u, 10u)";
  local_128 = 0;
  local_120 = 0;
  *(undefined4 **)(*(long *)(*(long *)&in_RDI->field_0x8 + 8) + 0x20) = local_148;
  **(int **)&in_RDI->field_0x8 = **(int **)&in_RDI->field_0x8 + 1;
  *(undefined4 **)(*(long *)&in_RDI->field_0x8 + 8) = local_148;
  value = 10;
  Json::Value::Value(in_RDI,10);
  Json::Value::Value(in_RDI,value);
  ValueTest::checkIsEqual(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_RDI);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  Json::Value::~Value(in_stack_fffffffffffffe90);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)&in_RDI->field_0x8);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareUInt) {
  JSONTEST_ASSERT_PRED(checkIsLess(0u, 10u));
  JSONTEST_ASSERT_PRED(checkIsLess(0u, Json::Value::maxUInt));
  JSONTEST_ASSERT_PRED(checkIsEqual(10u, 10u));
}